

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ActivationSigmoidHard::MergePartialFromCodedStream
          (ActivationSigmoidHard *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  undefined8 in_RAX;
  int iVar7;
  ulong uVar8;
  int iVar9;
  undefined8 local_38;
  
  local_38 = in_RAX;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b7d52;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b7d52:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    iVar9 = 6;
    iVar7 = iVar9;
    if ((uVar8 & 0x100000000) == 0) {
LAB_003b7ddc:
      iVar7 = 7;
      if (((uVar5 & 7) != 4 && uVar5 != 0) &&
         (bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5), iVar7 = iVar9,
         bVar4)) goto LAB_003b7e01;
    }
    else {
      uVar6 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar6 == 2) {
        if ((char)uVar8 != '\x15') goto LAB_003b7ddc;
        puVar3 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
          bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)((long)&local_38 + 4));
          if (!bVar4) goto LAB_003b7e03;
        }
        else {
          local_38 = CONCAT44(*(undefined4 *)puVar3,(float)local_38);
          input->buffer_ = puVar3 + 4;
        }
        this->beta_ = local_38._4_4_;
      }
      else {
        if ((uVar6 != 1) || ((char)uVar8 != '\r')) goto LAB_003b7ddc;
        puVar3 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
          bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_38);
          if (!bVar4) goto LAB_003b7e03;
        }
        else {
          local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)puVar3);
          input->buffer_ = puVar3 + 4;
        }
        this->alpha_ = (float)local_38;
      }
LAB_003b7e01:
      iVar7 = 0;
    }
LAB_003b7e03:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool ActivationSigmoidHard::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ActivationSigmoidHard)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float alpha = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &alpha_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float beta = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &beta_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ActivationSigmoidHard)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ActivationSigmoidHard)
  return false;
#undef DO_
}